

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall wasm::TranslateToFuzzReader::makeSIMDShuffle(TranslateToFuzzReader *this)

{
  Index IVar1;
  Expression *right_00;
  reference pvVar2;
  SIMDShuffle *pSVar3;
  ulong local_48;
  size_t i;
  array<unsigned_char,_16UL> mask;
  Expression *right;
  Expression *local_18;
  Expression *left;
  TranslateToFuzzReader *this_local;
  
  left = (Expression *)this;
  Type::Type((Type *)&right,v128);
  local_18 = make(this,(Type)right);
  Type::Type((Type *)(mask._M_elems + 8),v128);
  right_00 = make(this,(Type)mask._M_elems._8_8_);
  for (local_48 = 0; local_48 < 0x10; local_48 = local_48 + 1) {
    IVar1 = upTo(this,0x20);
    pvVar2 = std::array<unsigned_char,_16UL>::operator[]((array<unsigned_char,_16UL> *)&i,local_48);
    *pvVar2 = (value_type_conflict1)IVar1;
  }
  pSVar3 = Builder::makeSIMDShuffle
                     (&this->builder,local_18,right_00,(array<unsigned_char,_16UL> *)&i);
  return (Expression *)pSVar3;
}

Assistant:

Expression* TranslateToFuzzReader::makeSIMDShuffle() {
  Expression* left = make(Type::v128);
  Expression* right = make(Type::v128);
  std::array<uint8_t, 16> mask;
  for (size_t i = 0; i < 16; ++i) {
    mask[i] = upTo(32);
  }
  return builder.makeSIMDShuffle(left, right, mask);
}